

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::InitExprToConstOffset
          (BinaryReaderObjdump *this,InitExpr *expr,uint32_t *out_offset)

{
  InitExprType IVar1;
  Result RVar2;
  
  IVar1 = expr->type;
  RVar2.enum_ = Ok;
  if (IVar1 < 8) {
    if ((0xdeU >> (IVar1 & 0x1f) & 1) == 0) {
      if (IVar1 == I32) {
        *out_offset = (expr->value).index;
        return (Result)RVar2.enum_;
      }
      *out_offset = 0;
      return (Result)RVar2.enum_;
    }
    Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                   "Segment/Elem offset must be an i32 init expr");
    RVar2.enum_ = Error;
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderObjdump::InitExprToConstOffset(const InitExpr& expr,
                                                  uint32_t* out_offset) {
  switch (expr.type) {
    case InitExprType::I32:
      *out_offset = expr.value.i32;
      break;
    case InitExprType::Global:
      *out_offset = 0;
      break;
    case InitExprType::I64:
    case InitExprType::F32:
    case InitExprType::F64:
    case InitExprType::V128:
    case InitExprType::FuncRef:
    case InitExprType::NullRef:
      err_stream_->Writef("Segment/Elem offset must be an i32 init expr");
      return Result::Error;
      break;
  }
  return Result::Ok;
}